

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall
cmCTestVC::RunChild(cmCTestVC *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *cmd,OutputParser *out,OutputParser *err,string *workDir,Encoding encoding)

{
  ostream *poVar1;
  ulong uVar2;
  cmUVProcessChainBuilder *this_00;
  reference pvVar3;
  bool local_131;
  undefined1 local_100 [8];
  vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> status;
  undefined1 local_c8 [8];
  cmUVProcessChainBuilder builder;
  string local_58;
  Encoding local_34;
  string *psStack_30;
  Encoding encoding_local;
  string *workDir_local;
  OutputParser *err_local;
  OutputParser *out_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_local;
  cmCTestVC *this_local;
  
  poVar1 = this->Log;
  local_34 = encoding;
  psStack_30 = workDir;
  workDir_local = (string *)err;
  err_local = out;
  out_local = (OutputParser *)cmd;
  cmd_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this;
  ComputeCommandLine(&local_58,cmd);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_c8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)workDir,(string *)&this->SourceDirectory);
  }
  this_00 = cmUVProcessChainBuilder::AddCommand
                      ((cmUVProcessChainBuilder *)local_c8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)out_local);
  std::__cxx11::string::string
            ((string *)
             &status.
              super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)workDir);
  cmUVProcessChainBuilder::SetWorkingDirectory
            (this_00,(string *)
                     &status.
                      super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &status.
              super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmProcessTools::RunProcess
            ((vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> *)
             local_100,(cmUVProcessChainBuilder *)local_c8,err_local,(OutputParser *)workDir_local,
             local_34);
  pvVar3 = std::vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>::front
                     ((vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> *
                      )local_100);
  local_131 = false;
  if (pvVar3->SpawnResult == 0) {
    pvVar3 = std::vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>::front
                       ((vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                         *)local_100);
    local_131 = pvVar3->ExitStatus == 0;
  }
  std::vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>::~vector
            ((vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> *)
             local_100);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_c8);
  return local_131;
}

Assistant:

bool cmCTestVC::RunChild(const std::vector<std::string>& cmd,
                         OutputParser* out, OutputParser* err,
                         std::string workDir, Encoding encoding)
{
  this->Log << cmCTestVC::ComputeCommandLine(cmd) << "\n";

  cmUVProcessChainBuilder builder;
  if (workDir.empty()) {
    workDir = this->SourceDirectory;
  }
  builder.AddCommand(cmd).SetWorkingDirectory(workDir);
  auto status = cmCTestVC::RunProcess(builder, out, err, encoding);
  return status.front().SpawnResult == 0 && status.front().ExitStatus == 0;
}